

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::HandleResponseFile
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,const_iterator argBeg,const_iterator argEnd)

{
  int iVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string line;
  string error;
  ifstream responseFile;
  string local_2b8;
  undefined8 local_298;
  char *local_290;
  long local_288;
  pointer local_280;
  string local_278;
  long *local_258;
  ulong local_250;
  long local_248 [2];
  basic_string_view<char,_std::char_traits<char>_> local_238 [2];
  byte abStack_218 [488];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argBeg._M_current != argEnd._M_current) {
    do {
      local_238[0]._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
      local_238[0]._M_len = (argBeg._M_current)->_M_string_length;
      __str._M_str = "@";
      __str._M_len = 1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(local_238,0,1,__str);
      if (iVar1 == 0) {
        std::__cxx11::string::substr((ulong)&local_2b8,(ulong)argBeg._M_current);
        std::ifstream::ifstream(local_238,local_2b8._M_dataplus._M_p,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((abStack_218[*(long *)(local_238[0]._M_len - 0x18)] & 5) == 0) {
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          local_2b8._M_string_length = 0;
          local_2b8.field_2._M_allocated_capacity =
               local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          cmsys::SystemTools::GetLineFromStream
                    ((istream *)local_238,&local_2b8,(bool *)0x0,0xffffffffffffffff);
          local_278._M_dataplus._M_p = (pointer)0x0;
          local_278._M_string_length = 0;
          local_278.field_2._M_allocated_capacity = 0;
          ParseUnixCommandLine
                    (local_2b8._M_dataplus._M_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_278);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,local_278._M_dataplus._M_p,
                     local_278._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_278);
          uVar2 = local_2b8.field_2._M_allocated_capacity;
          _Var3._M_p = local_2b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_00112442;
        }
        else {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          if ((argBeg._M_current)->_M_string_length == 0) {
            uVar2 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > __size (which is %zu)",
                               "basic_string_view::substr",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::ifstream::~ifstream(local_238);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(__return_storage_ptr__);
            _Unwind_Resume(uVar2);
          }
          local_288 = (argBeg._M_current)->_M_string_length - 1;
          local_280 = ((argBeg._M_current)->_M_dataplus)._M_p + 1;
          local_2b8._M_dataplus._M_p = (pointer)0x1c;
          local_2b8._M_string_length = 0x262514;
          local_2b8.field_2._M_allocated_capacity = local_250;
          local_2b8.field_2._8_8_ = local_258;
          local_298 = 5;
          local_290 = "):\n  ";
          views._M_len = 4;
          views._M_array = (iterator)&local_2b8;
          cmCatViews_abi_cxx11_(&local_278,views);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          Error(&local_278);
          uVar2 = local_278.field_2._M_allocated_capacity;
          _Var3._M_p = local_278._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
LAB_00112442:
            operator_delete(_Var3._M_p,uVar2 + 1);
          }
        }
        std::ifstream::~ifstream(local_238);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,argBeg._M_current);
      }
      argBeg._M_current = argBeg._M_current + 1;
    } while (argBeg._M_current != argEnd._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::HandleResponseFile(
  std::vector<std::string>::const_iterator argBeg,
  std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "@")) {
      cmsys::ifstream responseFile(arg.substr(1).c_str(), std::ios::in);
      if (!responseFile) {
        std::string error = cmStrCat("failed to open for reading (",
                                     cmSystemTools::GetLastSystemError(),
                                     "):\n  ", cm::string_view(arg).substr(1));
        cmSystemTools::Error(error);
      } else {
        std::string line;
        cmSystemTools::GetLineFromStream(responseFile, line);
        std::vector<std::string> args2;
#ifdef _WIN32
        cmSystemTools::ParseWindowsCommandLine(line.c_str(), args2);
#else
        cmSystemTools::ParseUnixCommandLine(line.c_str(), args2);
#endif
        cm::append(arg_full, args2);
      }
    } else {
      arg_full.push_back(arg);
    }
  }
  return arg_full;
}